

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_asl_acc_ignores_carry_Test::~CpuTest_asl_acc_ignores_carry_Test
          (CpuTest_asl_acc_ignores_carry_Test *this)

{
  CpuTest_asl_acc_ignores_carry_Test *this_local;
  
  ~CpuTest_asl_acc_ignores_carry_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, asl_acc_ignores_carry) {
    stage_instruction(ASL_ACC);
    registers.p = C_FLAG;
    registers.a = 0b00110011;
    expected.a = 0b01100110;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}